

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::DeserializePropertyIdArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto,FunctionBody *functionBody)

{
  byte bVar1;
  Type TVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  Type TVar7;
  undefined4 *puVar8;
  byte *pbVar9;
  PropertyIdArray *this_00;
  size_t sVar10;
  ByteCodeCache *this_01;
  byte *current;
  int i_1;
  int i;
  PropertyId *elements;
  PropertyIdArray *result;
  byte extraSlotCount;
  int propertyCount;
  SerializedPropertyIdArray *serialized;
  FunctionBody *functionBody_local;
  ByteBlock *deserializeInto_local;
  byte *buffer_local;
  ScriptContext *scriptContext_local;
  ByteCodeBufferReader *this_local;
  
  TVar2 = *(Type *)(buffer + 5);
  bVar1 = buffer[9];
  uVar3 = *(uint *)buffer;
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 < (ulong)uVar3 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1220,
                                "(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength()"
                               );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pbVar9 = ByteBlock::GetBuffer(deserializeInto);
  this_00 = (PropertyIdArray *)(pbVar9 + *(uint *)buffer);
  this_00->count = TVar2;
  this_00->extraSlots = bVar1;
  uVar3 = *(uint *)buffer;
  sVar10 = PropertyIdArray::GetDataSize(this_00);
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 < uVar3 + sVar10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1224,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_00->hadDuplicates = (Type)(buffer[10] & 1);
  this_00->has__proto__ = (Type)(buffer[0xb] & 1);
  for (current._4_4_ = 0; current._4_4_ < (int)TVar2; current._4_4_ = current._4_4_ + 1) {
    this_01 = FunctionBody::GetByteCodeCache(functionBody);
    TVar7 = ByteCodeCache::LookupPropertyId
                      (this_01,*(PropertyId *)(buffer + (long)current._4_4_ * 4 + 0xc));
    (&this_00[1].count)[current._4_4_] = TVar7;
  }
  for (current._0_4_ = 0; (int)current < (int)(uint)bVar1; current._0_4_ = (int)current + 1) {
    (&this_00[1].count)[(int)(TVar2 + (int)current)] =
         *(Type *)(buffer + (long)(int)(TVar2 + (int)current) * 4 + 0xc);
  }
  return buffer + (long)(int)(TVar2 + bVar1) * 4 + 0xc;
}

Assistant:

const byte *
    DeserializePropertyIdArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto, FunctionBody * functionBody)
    {
        auto serialized = (serialization_alignment const Js::SerializedPropertyIdArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxPropIdArray);
#endif
        auto propertyCount = serialized->propertyCount;
        auto extraSlotCount = serialized->extraSlots;

        Assert(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength());
        auto result = (PropertyIdArray *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = propertyCount;
        result->extraSlots = extraSlotCount;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());
        result->hadDuplicates = serialized->hadDuplicates;
        result->has__proto__ = serialized->has__proto__;

        auto elements = (PropertyId*)(serialized + 1);
        for(int i=0;i<propertyCount;++i)
        {
            result->elements[i] = functionBody->GetByteCodeCache()->LookupPropertyId(elements[i]);
        }
        for(int i=0;i<extraSlotCount;++i)
        {
            result->elements[propertyCount + i] = elements[propertyCount + i];
        }
        auto current = buffer +
            sizeof(serialization_alignment const Js::SerializedPropertyIdArray) + (propertyCount + extraSlotCount) * sizeof(PropertyId);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxPropIdArray);
#endif
        return current;
    }